

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predicates.cxx
# Opt level: O1

double orient3dslow(double *pa,double *pb,double *pc,double *pd)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int elen;
  double dVar8;
  double b;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double b_00;
  double dVar18;
  double b_01;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  double dVar38;
  double dVar39;
  double dVar40;
  double dVar41;
  double dVar42;
  double cxay [8];
  double bxay [8];
  double axby [8];
  double cxby [8];
  double axcy [8];
  double bxcy [8];
  double temp16 [16];
  double bdet [64];
  double adet [64];
  double temp32t [32];
  double temp32 [32];
  double cdet [64];
  double deter [192];
  double abdet [128];
  double local_1438;
  double local_1430;
  double local_1428;
  double local_1420;
  double local_1418;
  double local_1410;
  double local_1408;
  double local_1400;
  double local_13f8;
  double local_13f0;
  double local_13e8;
  double local_13e0;
  double local_13d8;
  double local_13d0;
  double local_13c8;
  double local_13c0;
  double local_13b8;
  double local_13b0;
  double local_13a8;
  double local_13a0;
  double local_1398;
  double local_1390;
  double local_1388;
  double local_1380;
  double local_1378;
  double local_1370;
  double local_1368;
  double local_1360;
  double local_1358;
  double local_1350;
  double local_1348;
  double local_1340;
  double local_1338;
  double local_1330;
  double local_1328;
  double local_1320;
  double local_1318;
  double local_1310;
  double local_1308;
  double local_1300;
  double local_12f8;
  double local_12f0;
  double local_12e8;
  double local_12e0;
  double local_12d8;
  double local_12d0;
  double local_12c8;
  double local_12c0;
  double local_12b8 [16];
  double local_1238 [64];
  double local_1038 [64];
  double local_e38 [32];
  double local_d38 [32];
  double local_c38 [63];
  double adStack_a40 [193];
  double local_438 [129];
  
  dVar1 = *pa;
  dVar2 = pa[1];
  dVar3 = *pd;
  dVar8 = pd[1];
  dVar41 = dVar1 - dVar3;
  dVar35 = (dVar1 - (dVar41 + (dVar1 - dVar41))) + ((dVar1 - dVar41) - dVar3);
  dVar17 = dVar2 - dVar8;
  dVar23 = (dVar2 - (dVar17 + (dVar2 - dVar17))) + ((dVar2 - dVar17) - dVar8);
  dVar1 = pa[2];
  dVar2 = pd[2];
  b_00 = dVar1 - dVar2;
  dVar4 = *pb;
  dVar26 = pb[1];
  dVar18 = dVar4 - dVar3;
  dVar24 = (dVar4 - (dVar18 + (dVar4 - dVar18))) + ((dVar4 - dVar18) - dVar3);
  dVar25 = dVar26 - dVar8;
  dVar37 = (dVar26 - (dVar25 + (dVar26 - dVar25))) + ((dVar26 - dVar25) - dVar8);
  dVar4 = pb[2];
  b_01 = dVar4 - dVar2;
  dVar26 = *pc;
  dVar19 = dVar26 - dVar3;
  dVar26 = (dVar26 - (dVar19 + (dVar26 - dVar19))) + ((dVar26 - dVar19) - dVar3);
  dVar3 = pc[1];
  dVar12 = dVar3 - dVar8;
  dVar27 = (dVar3 - (dVar12 + (dVar3 - dVar12))) + ((dVar3 - dVar12) - dVar8);
  dVar3 = pc[2];
  b = dVar3 - dVar2;
  dVar9 = dVar35 * splitter - (dVar35 * splitter - dVar35);
  dVar10 = splitter * dVar37 - (splitter * dVar37 - dVar37);
  dVar8 = dVar35 * dVar37;
  dVar20 = dVar35 - dVar9;
  dVar11 = dVar37 - dVar10;
  local_13b8 = dVar20 * dVar11 - (((dVar8 - dVar9 * dVar10) - dVar20 * dVar10) - dVar9 * dVar11);
  dVar32 = dVar41 * splitter - (dVar41 * splitter - dVar41);
  dVar13 = dVar41 * dVar37;
  dVar21 = dVar41 - dVar32;
  dVar10 = dVar11 * dVar21 - (((dVar13 - dVar32 * dVar10) - dVar10 * dVar21) - dVar32 * dVar11);
  dVar28 = dVar8 + dVar10;
  dVar8 = (dVar8 - (dVar28 - (dVar28 - dVar8))) + (dVar10 - (dVar28 - dVar8));
  dVar29 = dVar13 + dVar28;
  dVar28 = dVar28 - (dVar29 - dVar13);
  dVar14 = dVar25 * splitter - (dVar25 * splitter - dVar25);
  dVar36 = dVar35 * dVar25;
  dVar22 = dVar25 - dVar14;
  dVar10 = dVar20 * dVar22 - (((dVar36 - dVar9 * dVar14) - dVar20 * dVar14) - dVar9 * dVar22);
  dVar11 = dVar10 + dVar8;
  local_13b0 = (dVar8 - (dVar11 - (dVar11 - dVar8))) + (dVar10 - (dVar11 - dVar8));
  dVar8 = dVar28 + dVar11;
  dVar33 = (dVar28 - (dVar8 - (dVar8 - dVar28))) + (dVar11 - (dVar8 - dVar28));
  dVar34 = dVar29 + dVar8;
  dVar30 = (dVar29 - (dVar34 - (dVar34 - dVar29))) + (dVar8 - (dVar34 - dVar29));
  dVar10 = -dVar17;
  dVar11 = -dVar23;
  dVar13 = -dVar25;
  dVar38 = -dVar37;
  dVar15 = -dVar12;
  dVar28 = -dVar27;
  dVar31 = dVar35 * dVar28;
  dVar29 = dVar28 * dVar41;
  dVar35 = dVar35 * dVar15;
  dVar16 = dVar15 * dVar41;
  dVar41 = dVar41 * dVar25;
  dVar14 = dVar22 * dVar21 - (((dVar41 - dVar32 * dVar14) - dVar14 * dVar21) - dVar32 * dVar22);
  dVar8 = dVar36 + dVar14;
  dVar22 = (dVar36 - (dVar8 - (dVar8 - dVar36))) + (dVar14 - (dVar8 - dVar36));
  dVar14 = dVar22 + dVar33;
  local_13a8 = (dVar33 - (dVar14 - (dVar14 - dVar33))) + (dVar22 - (dVar14 - dVar33));
  dVar22 = dVar30 + dVar14;
  dVar36 = (dVar30 - (dVar22 - (dVar22 - dVar30))) + (dVar14 - (dVar22 - dVar30));
  dVar14 = dVar34 + dVar22;
  dVar30 = (dVar34 - (dVar14 - (dVar14 - dVar34))) + (dVar22 - (dVar14 - dVar34));
  dVar33 = dVar41 + dVar8;
  dVar41 = (dVar41 - (dVar33 - (dVar33 - dVar41))) + (dVar8 - (dVar33 - dVar41));
  dVar8 = dVar41 + dVar36;
  local_13a0 = (dVar36 - (dVar8 - (dVar8 - dVar36))) + (dVar41 - (dVar8 - dVar36));
  dVar22 = dVar30 + dVar8;
  dVar30 = (dVar30 - (dVar22 - (dVar22 - dVar30))) + (dVar8 - (dVar22 - dVar30));
  dVar41 = dVar14 + dVar22;
  dVar14 = (dVar14 - (dVar41 - (dVar41 - dVar14))) + (dVar22 - (dVar41 - dVar14));
  dVar8 = dVar33 + dVar30;
  local_1398 = (dVar30 - (dVar8 - (dVar8 - dVar30))) + (dVar33 - (dVar8 - dVar30));
  dVar22 = dVar14 + dVar8;
  local_1390 = (dVar14 - (dVar22 - (dVar22 - dVar14))) + (dVar8 - (dVar22 - dVar14));
  local_1380 = dVar41 + dVar22;
  local_1388 = (dVar41 - (local_1380 - (local_1380 - dVar41))) + (dVar22 - (local_1380 - dVar41));
  dVar39 = dVar24 * splitter - (dVar24 * splitter - dVar24);
  dVar41 = splitter * dVar11 - (dVar23 + splitter * dVar11);
  dVar14 = dVar24 * dVar11;
  dVar33 = dVar24 - dVar39;
  dVar8 = dVar11 - dVar41;
  local_13f8 = dVar33 * dVar8 - (((dVar14 - dVar39 * dVar41) - dVar33 * dVar41) - dVar39 * dVar8);
  dVar40 = dVar18 * splitter - (dVar18 * splitter - dVar18);
  dVar11 = dVar11 * dVar18;
  dVar36 = dVar18 - dVar40;
  dVar41 = dVar8 * dVar36 - (((dVar11 - dVar40 * dVar41) - dVar41 * dVar36) - dVar40 * dVar8);
  dVar8 = dVar14 + dVar41;
  dVar41 = (dVar14 - (dVar8 - (dVar8 - dVar14))) + (dVar41 - (dVar8 - dVar14));
  dVar14 = dVar11 + dVar8;
  dVar8 = dVar8 - (dVar14 - dVar11);
  dVar34 = splitter * dVar10 - (dVar17 + splitter * dVar10);
  dVar30 = dVar24 * dVar10;
  dVar11 = dVar10 - dVar34;
  dVar42 = dVar33 * dVar11 - (((dVar30 - dVar39 * dVar34) - dVar33 * dVar34) - dVar39 * dVar11);
  dVar22 = dVar42 + dVar41;
  local_13f0 = (dVar41 - (dVar22 - (dVar22 - dVar41))) + (dVar42 - (dVar22 - dVar41));
  dVar41 = dVar8 + dVar22;
  dVar8 = (dVar8 - (dVar41 - (dVar41 - dVar8))) + (dVar22 - (dVar41 - dVar8));
  dVar42 = dVar14 + dVar41;
  dVar14 = (dVar14 - (dVar42 - (dVar42 - dVar14))) + (dVar41 - (dVar42 - dVar14));
  dVar10 = dVar10 * dVar18;
  dVar11 = dVar11 * dVar36 - (((dVar10 - dVar40 * dVar34) - dVar34 * dVar36) - dVar40 * dVar11);
  dVar22 = dVar30 + dVar11;
  dVar41 = (dVar30 - (dVar22 - (dVar22 - dVar30))) + (dVar11 - (dVar22 - dVar30));
  dVar11 = dVar41 + dVar8;
  local_13e8 = (dVar8 - (dVar11 - (dVar11 - dVar8))) + (dVar41 - (dVar11 - dVar8));
  dVar41 = dVar14 + dVar11;
  dVar14 = (dVar14 - (dVar41 - (dVar41 - dVar14))) + (dVar11 - (dVar41 - dVar14));
  dVar8 = dVar42 + dVar41;
  dVar30 = (dVar42 - (dVar8 - (dVar8 - dVar42))) + (dVar41 - (dVar8 - dVar42));
  dVar11 = dVar10 + dVar22;
  dVar41 = (dVar10 - (dVar11 - (dVar11 - dVar10))) + (dVar22 - (dVar11 - dVar10));
  dVar10 = dVar41 + dVar14;
  local_13e0 = (dVar14 - (dVar10 - (dVar10 - dVar14))) + (dVar41 - (dVar10 - dVar14));
  dVar14 = dVar30 + dVar10;
  dVar10 = (dVar30 - (dVar14 - (dVar14 - dVar30))) + (dVar10 - (dVar14 - dVar30));
  dVar41 = dVar8 + dVar14;
  dVar8 = (dVar8 - (dVar41 - (dVar41 - dVar8))) + (dVar14 - (dVar41 - dVar8));
  dVar14 = dVar11 + dVar10;
  local_13d8 = (dVar10 - (dVar14 - (dVar14 - dVar10))) + (dVar11 - (dVar14 - dVar10));
  dVar10 = dVar8 + dVar14;
  local_13d0 = (dVar8 - (dVar10 - (dVar10 - dVar8))) + (dVar14 - (dVar10 - dVar8));
  local_13c0 = dVar41 + dVar10;
  local_13c8 = (dVar41 - (local_13c0 - (local_13c0 - dVar41))) + (dVar10 - (local_13c0 - dVar41));
  dVar11 = splitter * dVar27 - (splitter * dVar27 - dVar27);
  dVar10 = dVar24 * dVar27;
  dVar8 = dVar27 - dVar11;
  local_12f8 = dVar33 * dVar8 - (((dVar10 - dVar39 * dVar11) - dVar33 * dVar11) - dVar39 * dVar8);
  dVar41 = dVar18 * dVar27;
  dVar8 = dVar8 * dVar36 - (((dVar41 - dVar40 * dVar11) - dVar11 * dVar36) - dVar40 * dVar8);
  dVar11 = dVar10 + dVar8;
  dVar10 = (dVar10 - (dVar11 - (dVar11 - dVar10))) + (dVar8 - (dVar11 - dVar10));
  dVar8 = dVar41 + dVar11;
  dVar11 = dVar11 - (dVar8 - dVar41);
  dVar22 = dVar12 * splitter - (dVar12 * splitter - dVar12);
  dVar24 = dVar24 * dVar12;
  dVar41 = dVar12 - dVar22;
  dVar30 = dVar33 * dVar41 - (((dVar24 - dVar39 * dVar22) - dVar33 * dVar22) - dVar39 * dVar41);
  dVar14 = dVar30 + dVar10;
  local_12f0 = (dVar10 - (dVar14 - (dVar14 - dVar10))) + (dVar30 - (dVar14 - dVar10));
  dVar30 = dVar11 + dVar14;
  dVar11 = (dVar11 - (dVar30 - (dVar30 - dVar11))) + (dVar14 - (dVar30 - dVar11));
  dVar10 = dVar8 + dVar30;
  dVar8 = (dVar8 - (dVar10 - (dVar10 - dVar8))) + (dVar30 - (dVar10 - dVar8));
  dVar18 = dVar18 * dVar12;
  dVar41 = dVar41 * dVar36 - (((dVar18 - dVar40 * dVar22) - dVar22 * dVar36) - dVar40 * dVar41);
  dVar14 = dVar24 + dVar41;
  dVar22 = (dVar24 - (dVar14 - (dVar14 - dVar24))) + (dVar41 - (dVar14 - dVar24));
  dVar41 = dVar22 + dVar11;
  local_12e8 = (dVar11 - (dVar41 - (dVar41 - dVar11))) + (dVar22 - (dVar41 - dVar11));
  dVar22 = dVar8 + dVar41;
  dVar8 = (dVar8 - (dVar22 - (dVar22 - dVar8))) + (dVar41 - (dVar22 - dVar8));
  dVar11 = dVar10 + dVar22;
  dVar10 = (dVar10 - (dVar11 - (dVar11 - dVar10))) + (dVar22 - (dVar11 - dVar10));
  dVar41 = dVar18 + dVar14;
  dVar22 = (dVar18 - (dVar41 - (dVar41 - dVar18))) + (dVar14 - (dVar41 - dVar18));
  dVar14 = dVar22 + dVar8;
  local_12e0 = (dVar8 - (dVar14 - (dVar14 - dVar8))) + (dVar22 - (dVar14 - dVar8));
  dVar22 = dVar10 + dVar14;
  dVar10 = (dVar10 - (dVar22 - (dVar22 - dVar10))) + (dVar14 - (dVar22 - dVar10));
  dVar8 = dVar11 + dVar22;
  dVar11 = (dVar11 - (dVar8 - (dVar8 - dVar11))) + (dVar22 - (dVar8 - dVar11));
  dVar14 = dVar41 + dVar10;
  local_12d8 = (dVar10 - (dVar14 - (dVar14 - dVar10))) + (dVar41 - (dVar14 - dVar10));
  dVar10 = dVar11 + dVar14;
  local_12d0 = (dVar11 - (dVar10 - (dVar10 - dVar11))) + (dVar14 - (dVar10 - dVar11));
  local_12c0 = dVar8 + dVar10;
  local_12c8 = (dVar8 - (local_12c0 - (local_12c0 - dVar8))) + (dVar10 - (local_12c0 - dVar8));
  dVar33 = splitter * dVar26 - (splitter * dVar26 - dVar26);
  dVar41 = splitter * dVar38 - (dVar37 + splitter * dVar38);
  dVar11 = dVar26 * dVar38;
  dVar10 = dVar26 - dVar33;
  dVar8 = dVar38 - dVar41;
  local_1378 = dVar10 * dVar8 - (((dVar11 - dVar33 * dVar41) - dVar10 * dVar41) - dVar33 * dVar8);
  dVar18 = dVar19 * splitter - (dVar19 * splitter - dVar19);
  dVar38 = dVar38 * dVar19;
  dVar34 = dVar19 - dVar18;
  dVar8 = dVar8 * dVar34 - (((dVar38 - dVar18 * dVar41) - dVar41 * dVar34) - dVar18 * dVar8);
  dVar14 = dVar11 + dVar8;
  dVar41 = (dVar11 - (dVar14 - (dVar14 - dVar11))) + (dVar8 - (dVar14 - dVar11));
  dVar11 = dVar38 + dVar14;
  dVar14 = dVar14 - (dVar11 - dVar38);
  dVar8 = splitter * dVar13 - (dVar25 + splitter * dVar13);
  dVar22 = dVar26 * dVar13;
  dVar24 = dVar13 - dVar8;
  dVar30 = dVar10 * dVar24 - (((dVar22 - dVar33 * dVar8) - dVar10 * dVar8) - dVar33 * dVar24);
  dVar25 = dVar30 + dVar41;
  local_1370 = (dVar41 - (dVar25 - (dVar25 - dVar41))) + (dVar30 - (dVar25 - dVar41));
  dVar30 = dVar14 + dVar25;
  dVar14 = (dVar14 - (dVar30 - (dVar30 - dVar14))) + (dVar25 - (dVar30 - dVar14));
  dVar41 = dVar11 + dVar30;
  dVar11 = (dVar11 - (dVar41 - (dVar41 - dVar11))) + (dVar30 - (dVar41 - dVar11));
  dVar13 = dVar13 * dVar19;
  dVar8 = dVar24 * dVar34 - (((dVar13 - dVar18 * dVar8) - dVar8 * dVar34) - dVar18 * dVar24);
  dVar25 = dVar22 + dVar8;
  dVar8 = (dVar22 - (dVar25 - (dVar25 - dVar22))) + (dVar8 - (dVar25 - dVar22));
  dVar24 = dVar8 + dVar14;
  local_1368 = (dVar14 - (dVar24 - (dVar24 - dVar14))) + (dVar8 - (dVar24 - dVar14));
  dVar22 = dVar11 + dVar24;
  dVar8 = (dVar11 - (dVar22 - (dVar22 - dVar11))) + (dVar24 - (dVar22 - dVar11));
  dVar14 = dVar41 + dVar22;
  dVar11 = (dVar41 - (dVar14 - (dVar14 - dVar41))) + (dVar22 - (dVar14 - dVar41));
  dVar41 = dVar13 + dVar25;
  dVar22 = (dVar13 - (dVar41 - (dVar41 - dVar13))) + (dVar25 - (dVar41 - dVar13));
  dVar13 = dVar22 + dVar8;
  local_1360 = (dVar8 - (dVar13 - (dVar13 - dVar8))) + (dVar22 - (dVar13 - dVar8));
  dVar22 = dVar11 + dVar13;
  dVar11 = (dVar11 - (dVar22 - (dVar22 - dVar11))) + (dVar13 - (dVar22 - dVar11));
  dVar8 = dVar14 + dVar22;
  dVar13 = (dVar14 - (dVar8 - (dVar8 - dVar14))) + (dVar22 - (dVar8 - dVar14));
  dVar14 = dVar41 + dVar11;
  local_1358 = (dVar11 - (dVar14 - (dVar14 - dVar11))) + (dVar41 - (dVar14 - dVar11));
  dVar11 = dVar13 + dVar14;
  local_1350 = (dVar13 - (dVar11 - (dVar11 - dVar13))) + (dVar14 - (dVar11 - dVar13));
  local_1340 = dVar8 + dVar11;
  local_1348 = (dVar8 - (local_1340 - (local_1340 - dVar8))) + (dVar11 - (local_1340 - dVar8));
  dVar13 = dVar23 * splitter - (dVar23 * splitter - dVar23);
  dVar11 = dVar23 * dVar26;
  dVar8 = dVar23 - dVar13;
  local_1438 = dVar10 * dVar8 - (((dVar11 - dVar33 * dVar13) - dVar10 * dVar13) - dVar33 * dVar8);
  dVar23 = dVar23 * dVar19;
  dVar8 = dVar8 * dVar34 - (((dVar23 - dVar18 * dVar13) - dVar13 * dVar34) - dVar18 * dVar8);
  dVar13 = dVar11 + dVar8;
  dVar41 = (dVar11 - (dVar13 - (dVar13 - dVar11))) + (dVar8 - (dVar13 - dVar11));
  dVar11 = dVar23 + dVar13;
  dVar13 = dVar13 - (dVar11 - dVar23);
  dVar14 = dVar17 * splitter - (dVar17 * splitter - dVar17);
  dVar26 = dVar26 * dVar17;
  dVar19 = dVar19 * dVar17;
  dVar17 = dVar17 - dVar14;
  dVar8 = dVar10 * dVar17 - (((dVar26 - dVar33 * dVar14) - dVar10 * dVar14) - dVar33 * dVar17);
  dVar10 = dVar8 + dVar41;
  local_1430 = (dVar41 - (dVar10 - (dVar10 - dVar41))) + (dVar8 - (dVar10 - dVar41));
  dVar8 = dVar13 + dVar10;
  dVar13 = (dVar13 - (dVar8 - (dVar8 - dVar13))) + (dVar10 - (dVar8 - dVar13));
  dVar10 = dVar11 + dVar8;
  dVar11 = (dVar11 - (dVar10 - (dVar10 - dVar11))) + (dVar8 - (dVar10 - dVar11));
  dVar8 = dVar17 * dVar34 - (((dVar19 - dVar18 * dVar14) - dVar14 * dVar34) - dVar18 * dVar17);
  dVar41 = dVar26 + dVar8;
  dVar26 = (dVar26 - (dVar41 - (dVar41 - dVar26))) + (dVar8 - (dVar41 - dVar26));
  dVar8 = dVar26 + dVar13;
  local_1428 = (dVar13 - (dVar8 - (dVar8 - dVar13))) + (dVar26 - (dVar8 - dVar13));
  dVar26 = dVar11 + dVar8;
  dVar11 = (dVar11 - (dVar26 - (dVar26 - dVar11))) + (dVar8 - (dVar26 - dVar11));
  dVar8 = dVar10 + dVar26;
  dVar26 = (dVar10 - (dVar8 - (dVar8 - dVar10))) + (dVar26 - (dVar8 - dVar10));
  dVar13 = dVar19 + dVar41;
  dVar41 = (dVar19 - (dVar13 - (dVar13 - dVar19))) + (dVar41 - (dVar13 - dVar19));
  dVar10 = dVar41 + dVar11;
  local_1420 = (dVar11 - (dVar10 - (dVar10 - dVar11))) + (dVar41 - (dVar10 - dVar11));
  dVar11 = dVar26 + dVar10;
  dVar26 = (dVar26 - (dVar11 - (dVar11 - dVar26))) + (dVar10 - (dVar11 - dVar26));
  dVar10 = dVar8 + dVar11;
  dVar8 = (dVar8 - (dVar10 - (dVar10 - dVar8))) + (dVar11 - (dVar10 - dVar8));
  dVar11 = dVar13 + dVar26;
  local_1418 = (dVar26 - (dVar11 - (dVar11 - dVar26))) + (dVar13 - (dVar11 - dVar26));
  dVar26 = dVar8 + dVar11;
  local_1410 = (dVar8 - (dVar26 - (dVar26 - dVar8))) + (dVar11 - (dVar26 - dVar8));
  local_1400 = dVar10 + dVar26;
  local_1408 = (dVar10 - (local_1400 - (local_1400 - dVar10))) + (dVar26 - (local_1400 - dVar10));
  dVar8 = splitter * dVar28 - (dVar27 + splitter * dVar28);
  dVar28 = dVar28 - dVar8;
  local_1338 = dVar20 * dVar28 - (((dVar31 - dVar9 * dVar8) - dVar20 * dVar8) - dVar9 * dVar28);
  dVar8 = dVar28 * dVar21 - (((dVar29 - dVar32 * dVar8) - dVar8 * dVar21) - dVar32 * dVar28);
  dVar10 = dVar31 + dVar8;
  dVar11 = (dVar31 - (dVar10 - (dVar10 - dVar31))) + (dVar8 - (dVar10 - dVar31));
  dVar8 = dVar29 + dVar10;
  dVar10 = dVar10 - (dVar8 - dVar29);
  dVar13 = splitter * dVar15 - (dVar12 + splitter * dVar15);
  dVar15 = dVar15 - dVar13;
  dVar9 = dVar20 * dVar15 - (((dVar35 - dVar9 * dVar13) - dVar20 * dVar13) - dVar9 * dVar15);
  dVar26 = dVar9 + dVar11;
  local_1330 = (dVar11 - (dVar26 - (dVar26 - dVar11))) + (dVar9 - (dVar26 - dVar11));
  dVar11 = dVar10 + dVar26;
  dVar9 = (dVar10 - (dVar11 - (dVar11 - dVar10))) + (dVar26 - (dVar11 - dVar10));
  dVar26 = dVar8 + dVar11;
  dVar8 = (dVar8 - (dVar26 - (dVar26 - dVar8))) + (dVar11 - (dVar26 - dVar8));
  dVar11 = dVar15 * dVar21 - (((dVar16 - dVar32 * dVar13) - dVar13 * dVar21) - dVar32 * dVar15);
  dVar10 = dVar35 + dVar11;
  dVar11 = (dVar35 - (dVar10 - (dVar10 - dVar35))) + (dVar11 - (dVar10 - dVar35));
  dVar35 = dVar11 + dVar9;
  local_1328 = (dVar9 - (dVar35 - (dVar35 - dVar9))) + (dVar11 - (dVar35 - dVar9));
  dVar9 = dVar8 + dVar35;
  dVar8 = (dVar8 - (dVar9 - (dVar9 - dVar8))) + (dVar35 - (dVar9 - dVar8));
  dVar35 = dVar26 + dVar9;
  dVar26 = (dVar26 - (dVar35 - (dVar35 - dVar26))) + (dVar9 - (dVar35 - dVar26));
  dVar11 = dVar16 + dVar10;
  dVar10 = (dVar16 - (dVar11 - (dVar11 - dVar16))) + (dVar10 - (dVar11 - dVar16));
  dVar9 = dVar10 + dVar8;
  local_1320 = (dVar8 - (dVar9 - (dVar9 - dVar8))) + (dVar10 - (dVar9 - dVar8));
  dVar10 = dVar26 + dVar9;
  dVar26 = (dVar26 - (dVar10 - (dVar10 - dVar26))) + (dVar9 - (dVar10 - dVar26));
  dVar8 = dVar35 + dVar10;
  dVar35 = (dVar35 - (dVar8 - (dVar8 - dVar35))) + (dVar10 - (dVar8 - dVar35));
  dVar9 = dVar11 + dVar26;
  local_1318 = (dVar26 - (dVar9 - (dVar9 - dVar26))) + (dVar11 - (dVar9 - dVar26));
  dVar26 = dVar35 + dVar9;
  local_1310 = (dVar35 - (dVar26 - (dVar26 - dVar35))) + (dVar9 - (dVar26 - dVar35));
  local_1300 = dVar8 + dVar26;
  local_1308 = (dVar8 - (local_1300 - (local_1300 - dVar8))) + (dVar26 - (local_1300 - dVar8));
  iVar5 = fast_expansion_sum_zeroelim(8,&local_12f8,8,&local_1378,local_12b8);
  iVar6 = scale_expansion_zeroelim(iVar5,local_12b8,b_00,local_d38);
  iVar5 = scale_expansion_zeroelim
                    (iVar5,local_12b8,(dVar1 - (b_00 + (dVar1 - b_00))) + ((dVar1 - b_00) - dVar2),
                     local_e38);
  iVar5 = fast_expansion_sum_zeroelim(iVar6,local_d38,iVar5,local_e38,local_1038);
  iVar6 = fast_expansion_sum_zeroelim(8,&local_1438,8,&local_1338,local_12b8);
  iVar7 = scale_expansion_zeroelim(iVar6,local_12b8,b_01,local_d38);
  iVar6 = scale_expansion_zeroelim
                    (iVar6,local_12b8,(dVar4 - (b_01 + (dVar4 - b_01))) + ((dVar4 - b_01) - dVar2),
                     local_e38);
  iVar6 = fast_expansion_sum_zeroelim(iVar7,local_d38,iVar6,local_e38,local_1238);
  iVar7 = fast_expansion_sum_zeroelim(8,&local_13b8,8,&local_13f8,local_12b8);
  elen = scale_expansion_zeroelim(iVar7,local_12b8,b,local_d38);
  iVar7 = scale_expansion_zeroelim
                    (iVar7,local_12b8,(dVar3 - (b + (dVar3 - b))) + ((dVar3 - b) - dVar2),local_e38)
  ;
  iVar7 = fast_expansion_sum_zeroelim(elen,local_d38,iVar7,local_e38,local_c38);
  iVar5 = fast_expansion_sum_zeroelim(iVar5,local_1038,iVar6,local_1238,local_438);
  iVar5 = fast_expansion_sum_zeroelim(iVar5,local_438,iVar7,local_c38,adStack_a40 + 1);
  return adStack_a40[iVar5];
}

Assistant:

REAL orient3dslow(REAL *pa, REAL *pb, REAL *pc, REAL *pd)
{
  INEXACT REAL adx, ady, adz, bdx, bdy, bdz, cdx, cdy, cdz;
  REAL adxtail, adytail, adztail;
  REAL bdxtail, bdytail, bdztail;
  REAL cdxtail, cdytail, cdztail;
  REAL negate, negatetail;
  INEXACT REAL axby7, bxcy7, axcy7, bxay7, cxby7, cxay7;
  REAL axby[8], bxcy[8], axcy[8], bxay[8], cxby[8], cxay[8];
  REAL temp16[16], temp32[32], temp32t[32];
  int temp16len, temp32len, temp32tlen;
  REAL adet[64], bdet[64], cdet[64];
  int alen, blen, clen;
  REAL abdet[128];
  int ablen;
  REAL deter[192];
  int deterlen;

  INEXACT REAL bvirt;
  REAL avirt, bround, around;
  INEXACT REAL c;
  INEXACT REAL abig;
  REAL a0hi, a0lo, a1hi, a1lo, bhi, blo;
  REAL err1, err2, err3;
  INEXACT REAL _i, _j, _k, _l, _m, _n;
  REAL _0, _1, _2;

  Two_Diff(pa[0], pd[0], adx, adxtail);
  Two_Diff(pa[1], pd[1], ady, adytail);
  Two_Diff(pa[2], pd[2], adz, adztail);
  Two_Diff(pb[0], pd[0], bdx, bdxtail);
  Two_Diff(pb[1], pd[1], bdy, bdytail);
  Two_Diff(pb[2], pd[2], bdz, bdztail);
  Two_Diff(pc[0], pd[0], cdx, cdxtail);
  Two_Diff(pc[1], pd[1], cdy, cdytail);
  Two_Diff(pc[2], pd[2], cdz, cdztail);

  Two_Two_Product(adx, adxtail, bdy, bdytail,
                  axby7, axby[6], axby[5], axby[4],
                  axby[3], axby[2], axby[1], axby[0]);
  axby[7] = axby7;
  negate = -ady;
  negatetail = -adytail;
  Two_Two_Product(bdx, bdxtail, negate, negatetail,
                  bxay7, bxay[6], bxay[5], bxay[4],
                  bxay[3], bxay[2], bxay[1], bxay[0]);
  bxay[7] = bxay7;
  Two_Two_Product(bdx, bdxtail, cdy, cdytail,
                  bxcy7, bxcy[6], bxcy[5], bxcy[4],
                  bxcy[3], bxcy[2], bxcy[1], bxcy[0]);
  bxcy[7] = bxcy7;
  negate = -bdy;
  negatetail = -bdytail;
  Two_Two_Product(cdx, cdxtail, negate, negatetail,
                  cxby7, cxby[6], cxby[5], cxby[4],
                  cxby[3], cxby[2], cxby[1], cxby[0]);
  cxby[7] = cxby7;
  Two_Two_Product(cdx, cdxtail, ady, adytail,
                  cxay7, cxay[6], cxay[5], cxay[4],
                  cxay[3], cxay[2], cxay[1], cxay[0]);
  cxay[7] = cxay7;
  negate = -cdy;
  negatetail = -cdytail;
  Two_Two_Product(adx, adxtail, negate, negatetail,
                  axcy7, axcy[6], axcy[5], axcy[4],
                  axcy[3], axcy[2], axcy[1], axcy[0]);
  axcy[7] = axcy7;

  temp16len = fast_expansion_sum_zeroelim(8, bxcy, 8, cxby, temp16);
  temp32len = scale_expansion_zeroelim(temp16len, temp16, adz, temp32);
  temp32tlen = scale_expansion_zeroelim(temp16len, temp16, adztail, temp32t);
  alen = fast_expansion_sum_zeroelim(temp32len, temp32, temp32tlen, temp32t,
                                     adet);

  temp16len = fast_expansion_sum_zeroelim(8, cxay, 8, axcy, temp16);
  temp32len = scale_expansion_zeroelim(temp16len, temp16, bdz, temp32);
  temp32tlen = scale_expansion_zeroelim(temp16len, temp16, bdztail, temp32t);
  blen = fast_expansion_sum_zeroelim(temp32len, temp32, temp32tlen, temp32t,
                                     bdet);

  temp16len = fast_expansion_sum_zeroelim(8, axby, 8, bxay, temp16);
  temp32len = scale_expansion_zeroelim(temp16len, temp16, cdz, temp32);
  temp32tlen = scale_expansion_zeroelim(temp16len, temp16, cdztail, temp32t);
  clen = fast_expansion_sum_zeroelim(temp32len, temp32, temp32tlen, temp32t,
                                     cdet);

  ablen = fast_expansion_sum_zeroelim(alen, adet, blen, bdet, abdet);
  deterlen = fast_expansion_sum_zeroelim(ablen, abdet, clen, cdet, deter);

  return deter[deterlen - 1];
}